

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall celero::Printer::TableResult(Printer *this,shared_ptr<celero::ExperimentResult> *x)

{
  pointer pcVar1;
  pointer pbVar2;
  int64_t x_00;
  mapped_type *pmVar3;
  iterator iVar4;
  ConsoleColor x_01;
  key_type *__k;
  string *this_00;
  long lVar5;
  ulong uVar6;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  *entry;
  _Alloc_hider __k_00;
  double dVar7;
  allocator local_c1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  udmValues;
  shared_ptr<celero::UserDefinedMeasurementCollector> udmCollector;
  string local_70;
  string local_50;
  
  console::SetConsoleColor(Default);
  dVar7 = ExperimentResult::getBaselineMeasurement
                    ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr);
  if (dVar7 <= 1.0) {
    dVar7 = ExperimentResult::getBaselineMeasurement
                      ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>)
                       ._M_ptr);
    x_01 = (uint)(1.0 <= dVar7) * 4 + Green;
  }
  else {
    x_01 = Yellow;
  }
  console::SetConsoleColor(x_01);
  dVar7 = ExperimentResult::getBaselineMeasurement
                    ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr);
  PrintColumn_abi_cxx11_((string *)&udmValues,dVar7,5,0xf);
  std::operator<<((ostream *)&std::cout,(string *)&udmValues);
  std::__cxx11::string::~string((string *)&udmValues);
  console::SetConsoleColor(Default);
  console::SetConsoleColor(x_01);
  dVar7 = ExperimentResult::getUsPerCall
                    ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr);
  PrintColumn_abi_cxx11_((string *)&udmValues,dVar7,5,0xf);
  std::operator<<((ostream *)&std::cout,(string *)&udmValues);
  std::__cxx11::string::~string((string *)&udmValues);
  console::SetConsoleColor(Default);
  console::SetConsoleColor(x_01);
  dVar7 = ExperimentResult::getCallsPerSecond
                    ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr);
  PrintColumn_abi_cxx11_((string *)&udmValues,dVar7,2,0xf);
  std::operator<<((ostream *)&std::cout,(string *)&udmValues);
  std::__cxx11::string::~string((string *)&udmValues);
  console::SetConsoleColor(Default);
  console::SetConsoleColor(x_01);
  x_00 = ExperimentResult::getRAM
                   ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr);
  PrintColumn_abi_cxx11_((string *)&udmValues,x_00,0xf);
  std::operator<<((ostream *)&std::cout,(string *)&udmValues);
  std::__cxx11::string::~string((string *)&udmValues);
  console::SetConsoleColor(Default);
  udmValues._M_h._M_buckets = &udmValues._M_h._M_single_bucket;
  udmValues._M_h._M_bucket_count = 1;
  udmValues._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  udmValues._M_h._M_element_count = 0;
  udmValues._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  udmValues._M_h._M_rehash_policy._M_next_resize = 0;
  udmValues._M_h._M_single_bucket = (__node_base_ptr)0x0;
  ExperimentResult::getUserDefinedMeasurements((ExperimentResult *)&udmCollector);
  UserDefinedMeasurementCollector::getAggregateValues_abi_cxx11_
            ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
              *)&local_70,
             udmCollector.
             super___shared_ptr<celero::UserDefinedMeasurementCollector,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  for (__k_00._M_p = local_70._M_dataplus._M_p; __k_00._M_p != (pointer)local_70._M_string_length;
      __k_00._M_p = (pointer)&((key_type *)((long)__k_00._M_p + 0x20))->_M_string_length) {
    pcVar1 = (((key_type *)((long)__k_00._M_p + 0x20))->_M_dataplus)._M_p;
    pmVar3 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&udmValues,(key_type *)__k_00._M_p);
    *pmVar3 = (mapped_type)pcVar1;
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
             *)&local_70);
  lVar5 = 0;
  for (uVar6 = 0;
      pbVar2 = (this->userDefinedColumns).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar6 < (ulong)((long)(this->userDefinedColumns).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5);
      uVar6 = uVar6 + 1) {
    __k = (key_type *)((long)&(pbVar2->_M_dataplus)._M_p + lVar5);
    iVar4 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&udmValues._M_h,__k);
    if (iVar4.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_true>
        ._M_cur == (__node_type *)0x0) {
      std::__cxx11::string::string((string *)&local_50,"---",&local_c1);
      PrintCenter(&local_70,&local_50,
                  (this->columnWidths).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar6 + 9]);
      std::operator<<((ostream *)&std::cout,(string *)&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      this_00 = &local_50;
    }
    else {
      pmVar3 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     *)&udmValues._M_h,__k);
      PrintColumn_abi_cxx11_
                (&local_70,*pmVar3,2,
                 (this->columnWidths).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar6 + 9]);
      std::operator<<((ostream *)&std::cout,(string *)&local_70);
      this_00 = &local_70;
    }
    std::__cxx11::string::~string((string *)this_00);
    lVar5 = lVar5 + 0x20;
  }
  std::operator<<((ostream *)&std::cout,"\n");
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&udmCollector.
              super___shared_ptr<celero::UserDefinedMeasurementCollector,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&udmValues._M_h);
  return;
}

Assistant:

void Printer::TableResult(std::shared_ptr<celero::ExperimentResult> x)
	{
		celero::console::SetConsoleColor(celero::console::ConsoleColor::Default);

		celero::console::ConsoleColor temp_color;

		// Slower than Baseline
		if(x->getBaselineMeasurement() > 1.0)
		{
			temp_color = celero::console::ConsoleColor::Yellow;
		}
		else if(x->getBaselineMeasurement() < 1.0)
		{
			temp_color = celero::console::ConsoleColor::Green;
		}
		else
		{
			temp_color = celero::console::ConsoleColor::Cyan;
		}

		celero::console::SetConsoleColor(temp_color);
		std::cout << PrintColumn(x->getBaselineMeasurement());
		celero::console::SetConsoleColor(celero::console::ConsoleColor::Default);

		celero::console::SetConsoleColor(temp_color);
		std::cout << PrintColumn(x->getUsPerCall());
		celero::console::SetConsoleColor(celero::console::ConsoleColor::Default);

		celero::console::SetConsoleColor(temp_color);
		std::cout << PrintColumn(x->getCallsPerSecond(), 2);
		celero::console::SetConsoleColor(celero::console::ConsoleColor::Default);

		celero::console::SetConsoleColor(temp_color);
		std::cout << PrintColumn(x->getRAM());
		celero::console::SetConsoleColor(celero::console::ConsoleColor::Default);

		std::unordered_map<std::string, double> udmValues;

		auto udmCollector = x->getUserDefinedMeasurements();
		for(const auto& entry : udmCollector->getAggregateValues())
		{
			udmValues[entry.first] = entry.second;
		}

		for(size_t i = 0; i < this->userDefinedColumns.size(); ++i)
		{
			const auto& fieldName = this->userDefinedColumns[i];

			if(udmValues.find(fieldName) == udmValues.end())
			{
				std::cout << PrintCenter("---", this->columnWidths[i + PrintConstants::NumberOfColumns]);
			}
			else
			{
				std::cout << PrintColumn(udmValues.at(fieldName), 2, this->columnWidths[i + PrintConstants::NumberOfColumns]);
			}
		}

		std::cout << "\n";
	}